

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  bool bVar1;
  uint local_4c;
  uint local_48;
  uint8_t local_41;
  container_t *pcStack_40;
  uint8_t new_type;
  container_t *new_container;
  uint32_t container_max;
  uint32_t container_min;
  int32_t dst;
  int32_t src;
  uint32_t max_key;
  uint32_t min_key;
  roaring_array_t *ra;
  uint32_t max_local;
  uint32_t min_local;
  roaring_bitmap_t *r_local;
  
  if (min <= max) {
    src = min >> 0x10;
    dst = max >> 0x10;
    _max_key = &r->high_low_container;
    ra._0_4_ = max;
    ra._4_4_ = min;
    _max_local = r;
    container_max =
         count_less((r->high_low_container).keys,(r->high_low_container).size,
                    (uint16_t)(min >> 0x10));
    container_min = container_max;
    while( true ) {
      bVar1 = false;
      if ((int)container_min < _max_key->size) {
        bVar1 = (uint)_max_key->keys[(int)container_min] <= (uint)dst;
      }
      if (!bVar1) break;
      if (src == (uint)_max_key->keys[(int)container_min]) {
        local_48 = ra._4_4_ & 0xffff;
      }
      else {
        local_48 = 0;
      }
      new_container._4_4_ = local_48;
      if (dst == (uint)_max_key->keys[(int)container_min]) {
        local_4c = (uint32_t)ra & 0xffff;
      }
      else {
        local_4c = 0xffff;
      }
      new_container._0_4_ = local_4c;
      ra_unshare_container_at_index(_max_key,(uint16_t)container_min);
      pcStack_40 = container_remove_range
                             (_max_key->containers[(int)container_min],
                              _max_key->typecodes[(int)container_min],new_container._4_4_,
                              (uint32_t)new_container,&local_41);
      if (pcStack_40 != _max_key->containers[(int)container_min]) {
        container_free(_max_key->containers[(int)container_min],
                       _max_key->typecodes[(int)container_min]);
      }
      if (pcStack_40 != (container_t *)0x0) {
        ra_replace_key_and_container_at_index
                  (_max_key,container_max,_max_key->keys[(int)container_min],pcStack_40,local_41);
        container_max = container_max + 1;
      }
      container_min = container_min + 1;
    }
    if ((int)container_max < (int)container_min) {
      ra_shift_tail(_max_key,_max_key->size - container_min,container_max - container_min);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min = (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, src);
        container_t *new_container;
        uint8_t new_type;
        new_container = container_remove_range(ra->containers[src],
                                               ra->typecodes[src],
                                               container_min, container_max,
                                               &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src],
                           ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}